

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<TPZFlopCounter>::Subst_LForward
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *B)

{
  TPZFlopCounter *pTVar1;
  TPZBaseMatrix *pTVar2;
  int64_t iVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t i;
  TPZFlopCounter sum;
  int64_t c;
  int64_t r;
  char *in_stack_00000168;
  char *in_stack_00000170;
  TPZFlopCounter *in_stack_ffffffffffffff70;
  TPZFlopCounter *in_stack_ffffffffffffff78;
  REAL local_58 [2];
  undefined8 local_48;
  TPZFlopCounter local_40;
  long local_38;
  double local_30;
  TPZFlopCounter local_28;
  TPZFlopCounter *local_20;
  TPZFlopCounter *local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar3 != lVar4) || ((char)in_RDI[3] == '\0')) || ((char)in_RDI[3] != '\x04')) {
    Error(in_stack_00000170,in_stack_00000168);
  }
  local_18 = (TPZFlopCounter *)0x0;
  while( true ) {
    pTVar1 = local_18;
    lVar4 = (**(code **)(*in_RDI + 0x60))();
    if (lVar4 <= (long)pTVar1) break;
    local_20 = (TPZFlopCounter *)0x0;
    while( true ) {
      pTVar1 = local_20;
      iVar3 = TPZBaseMatrix::Cols(local_10);
      if (iVar3 <= (long)pTVar1) break;
      local_30 = 0.0;
      TPZFlopCounter::TPZFlopCounter(&local_28,&local_30);
      for (local_38 = 0; pTVar2 = local_10, local_38 < (long)local_18; local_38 = local_38 + 1) {
        local_48 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_18,local_38);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_38,local_20);
        local_40 = TPZFlopCounter::operator*(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        TPZFlopCounter::operator+=(&local_28,&local_40);
      }
      in_stack_ffffffffffffff70 = local_18;
      in_stack_ffffffffffffff78 = local_20;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_18,local_20);
      local_58[0] = (REAL)TPZFlopCounter::operator-
                                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])
                (pTVar2,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,local_58);
      local_20 = (TPZFlopCounter *)((long)&local_20->fVal + 1);
    }
    local_18 = (TPZFlopCounter *)((long)&local_18->fVal + 1);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}